

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::iterationAnalysis(HEkkDual *this)

{
  bool bVar1;
  
  if ((this->analysis->analyse_simplex_runtime_data == true) &&
     (2 < (this->ekk_instance_->options_->super_HighsOptionsStruct).log_dev_level)) {
    HEkk::computeInfeasibilitiesForReporting(this->ekk_instance_,kDual,this->solve_phase);
  }
  iterationAnalysisData(this);
  HighsSimplexAnalysis::iterationReport(this->analysis);
  if (this->edge_weight_mode == kSteepestEdge) {
    bVar1 = HEkk::switchToDevex(this->ekk_instance_);
    if (bVar1) {
      this->edge_weight_mode = kDevex;
      initialiseDevexFramework(this);
    }
  }
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::iterationRecord(this->analysis);
    return;
  }
  return;
}

Assistant:

void HEkkDual::iterationAnalysis() {
  // Compute the infeasibility data (expensive) if analysing run-time
  // data and the log level is at least kIterationReportLogType
  // (Verbose)
  const bool make_iteration_report = analysis->analyse_simplex_runtime_data &&
                                     ekk_instance_.options_->log_dev_level >=
                                         (HighsInt)kIterationReportLogType;
  if (make_iteration_report)
    ekk_instance_.computeInfeasibilitiesForReporting(SimplexAlgorithm::kDual,
                                                     solve_phase);
  // Possibly report on the iteration
  iterationAnalysisData();
  analysis->iterationReport();

  // Possibly switch from DSE to Devex
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    const bool switch_to_devex = ekk_instance_.switchToDevex();
    if (switch_to_devex) {
      edge_weight_mode = EdgeWeightMode::kDevex;
      initialiseDevexFramework();
    }
  }
  if (analysis->analyse_simplex_summary_data) analysis->iterationRecord();
}